

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumValueDescriptor::CopyTo
          (EnumValueDescriptor *this,EnumValueDescriptorProto *proto)

{
  string_view value;
  EnumValueDescriptorProto *this_00;
  int value_00;
  uint32_t *puVar1;
  Arena *arena;
  EnumValueOptions *pEVar2;
  EnumValueOptions *pEVar3;
  string_view local_50;
  EnumValueDescriptorProto *local_40;
  EnumValueDescriptorProto *proto_local;
  EnumValueDescriptor *this_local;
  char *local_28;
  string_view *local_20;
  EnumValueDescriptorProto *local_18;
  anon_union_32_1_493b367e_for_EnumValueDescriptorProto_3 *local_10;
  
  local_40 = proto;
  proto_local = (EnumValueDescriptorProto *)this;
  local_50 = name(this);
  local_20 = &local_50;
  local_10 = &proto->field_0;
  local_18 = proto;
  puVar1 = internal::HasBits<1>::operator[](&(proto->field_0)._impl_._has_bits_,0);
  *puVar1 = *puVar1 | 1;
  this_local = (EnumValueDescriptor *)local_20->_M_len;
  local_28 = local_20->_M_str;
  arena = MessageLite::GetArena((MessageLite *)proto);
  value._M_str = local_28;
  value._M_len = (size_t)this_local;
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value,arena);
  this_00 = local_40;
  value_00 = number(this);
  EnumValueDescriptorProto::set_number(this_00,value_00);
  pEVar2 = options(this);
  pEVar3 = EnumValueOptions::default_instance();
  if (pEVar2 != pEVar3) {
    pEVar2 = options(this);
    pEVar3 = EnumValueDescriptorProto::mutable_options(local_40);
    EnumValueOptions::operator=(pEVar3,pEVar2);
  }
  anon_unknown_24::RestoreFeaturesToOptions<google::protobuf::EnumValueDescriptorProto>
            (this->proto_features_,local_40);
  return;
}

Assistant:

void EnumValueDescriptor::CopyTo(EnumValueDescriptorProto* proto) const {
  proto->set_name(name());
  proto->set_number(number());

  if (&options() != &EnumValueOptions::default_instance()) {
    *proto->mutable_options() = options();
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}